

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDescriptorPoolTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::outOfPoolMemoryTest(TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  VkResult value;
  DeviceInterface *vk;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  char *pcVar5;
  VkDescriptorType value_00;
  long lVar6;
  allocator<char> local_445;
  int local_444;
  TestStatus *local_440;
  Context *local_438;
  VkDevice local_430;
  long local_428;
  VkDescriptorPoolSize descriptorPoolSize;
  VkDescriptorSetLayoutBinding descriptorSetLayoutBinding;
  VkDescriptorPoolCreateInfo descriptorPoolCreateInfo;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  rawSetLayouts;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  descriptorSetLayoutBindings;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_388;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  rawDescriptorSets;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_328;
  undefined1 local_308 [8];
  DeviceInterface *pDStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148 [2];
  deUint32 local_138 [2];
  string local_130 [32];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  string local_f8 [32];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  string local_c0 [32];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  string local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  string local_50 [32];
  
  local_440 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  local_430 = Context::getDevice(context);
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_308 = (undefined1  [8])
              (pvVar4->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_438 = context;
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_148[0]._M_current =
       (pvVar4->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_308,local_148,(char (*) [20])0x9aaab3);
  local_148[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000004;
  local_148[1]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000001;
  local_138[0] = 3;
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"Out of descriptor sets",(allocator<char> *)local_308);
  local_110 = 0x400000003;
  uStack_108 = 0x100000001;
  local_100 = 4;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"Out of descriptors (due to the number of sets)",
             (allocator<char> *)&descriptorPoolCreateInfo);
  local_d8 = 0x100000002;
  uStack_d0 = 0x100000003;
  local_c8 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"Out of descriptors (due to the number of bindings)",
             (allocator<char> *)&descriptorSetAllocateInfo);
  local_a0 = 0x200000003;
  uStack_98 = 0x200000001;
  local_90 = 2;
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Out of descriptors (due to descriptor array size)",
             (allocator<char> *)&local_388);
  local_68 = 0x100000005;
  uStack_60 = 0x300000002;
  local_58 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Out of descriptors (due to descriptor array size in all bindings)",
             (allocator<char> *)&descriptorSetLayoutInfo);
  local_308 = (undefined1  [8])local_438->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_300);
  std::operator<<((ostream *)&pDStack_300,
                  "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_300);
  local_444 = 0;
  lVar6 = 0;
  while (lVar6 != 5) {
    local_308 = (undefined1  [8])local_438->m_testCtx->m_log;
    local_428 = lVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_300);
    std::operator<<((ostream *)&pDStack_300,"Checking: ");
    lVar2 = local_428;
    lVar6 = local_428 * 7;
    std::operator<<((ostream *)&pDStack_300,local_130 + local_428 * 0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_300);
    value_00 = VK_DESCRIPTOR_TYPE_SAMPLER;
    while (value_00 != VK_DESCRIPTOR_TYPE_LAST) {
      local_308 = (undefined1  [8])local_438->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_300);
      std::operator<<((ostream *)&pDStack_300,"- ");
      pcVar5 = ::vk::getDescriptorTypeName(value_00);
      std::operator<<((ostream *)&pDStack_300,pcVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_300);
      descriptorPoolSize.descriptorCount = *(deUint32 *)&local_148[lVar6]._M_current;
      descriptorPoolCreateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      descriptorPoolCreateInfo.pNext = (void *)0x0;
      descriptorPoolCreateInfo.flags = 0;
      descriptorPoolCreateInfo.maxSets = *(deUint32 *)((long)&local_148[lVar2 * 7]._M_current + 4);
      descriptorPoolCreateInfo.poolSizeCount = 1;
      descriptorPoolCreateInfo.pPoolSizes = &descriptorPoolSize;
      descriptorPoolSize.type = value_00;
      ::vk::createDescriptorPool
                ((Move<vk::Handle<(vk::HandleType)21>_> *)local_308,vk,local_430,
                 &descriptorPoolCreateInfo,(VkAllocationCallbacks *)0x0);
      local_388.m_data.deleter.m_device = (VkDevice)local_2f8[0]._0_8_;
      local_388.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_2f8[0]._8_8_;
      local_388.m_data.object.m_internal = (deUint64)local_308;
      local_388.m_data.deleter.m_deviceIface = pDStack_300;
      local_308 = (undefined1  [8])0x0;
      pDStack_300 = (DeviceInterface *)0x0;
      local_2f8[0]._M_allocated_capacity = (VkDevice)0x0;
      local_2f8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_308);
      descriptorSetLayoutBinding.binding = 0;
      descriptorSetLayoutBinding.descriptorCount = local_138[lVar2 * 0xe + -1];
      descriptorSetLayoutBinding.stageFlags = 0x7fffffff;
      descriptorSetLayoutBinding.pImmutableSamplers = (VkSampler *)0x0;
      descriptorSetLayoutBinding.descriptorType = value_00;
      std::
      vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
      vector(&descriptorSetLayoutBindings,(ulong)local_138[lVar2 * 0xe + -2],
             &descriptorSetLayoutBinding,(allocator_type *)local_308);
      descriptorSetLayoutInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      descriptorSetLayoutInfo.pNext = (void *)0x0;
      descriptorSetLayoutInfo.flags = 0;
      descriptorSetLayoutInfo.bindingCount =
           (deUint32)
           (((long)descriptorSetLayoutBindings.
                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)descriptorSetLayoutBindings.
                  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      descriptorSetLayoutInfo.pBindings =
           descriptorSetLayoutBindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)local_308,vk,local_430,
                 &descriptorSetLayoutInfo,(VkAllocationCallbacks *)0x0);
      local_328.m_data.deleter.m_device = (VkDevice)local_2f8[0]._0_8_;
      local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_2f8[0]._8_8_;
      local_328.m_data.object.m_internal = (deUint64)local_308;
      local_328.m_data.deleter.m_deviceIface = pDStack_300;
      local_308 = (undefined1  [8])0x0;
      pDStack_300 = (DeviceInterface *)0x0;
      local_2f8[0]._M_allocated_capacity = (VkDevice)0x0;
      local_2f8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_308);
      std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::vector(&rawSetLayouts,(ulong)local_138[lVar2 * 0xe],(value_type *)&local_328,
               (allocator_type *)local_308);
      local_308 = (undefined1  [8])0x0;
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::vector(&rawDescriptorSets,(ulong)local_138[lVar2 * 0xe],(value_type *)local_308,
               (allocator_type *)&descriptorSetAllocateInfo);
      descriptorSetAllocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      descriptorSetAllocateInfo.pNext = (void *)0x0;
      descriptorSetAllocateInfo.descriptorPool.m_internal = local_388.m_data.object.m_internal;
      descriptorSetAllocateInfo.descriptorSetCount =
           (deUint32)
           ((ulong)((long)rawSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)rawSetLayouts.
                         super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
      descriptorSetAllocateInfo.pSetLayouts =
           rawSetLayouts.
           super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      value = (*vk->_vptr_DeviceInterface[0x3c])
                        (vk,local_430,&descriptorSetAllocateInfo,
                         rawDescriptorSets.
                         super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (value == VK_SUCCESS) {
        local_308 = (undefined1  [8])local_438->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_300);
        std::operator<<((ostream *)&pDStack_300,"  Allocation was successful anyway");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_300);
        bVar1 = true;
      }
      else {
        local_444 = local_444 + 1;
        bVar1 = true;
        if (value != VK_ERROR_OUT_OF_POOL_MEMORY_KHR && bVar3) {
          pcVar5 = ::vk::getResultName(value);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,pcVar5,&local_445)
          ;
          std::operator+(&local_168,"Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got ",&local_188);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_308,&local_168," instead");
          tcu::TestStatus::fail(local_440,(string *)local_308);
          std::__cxx11::string::~string((string *)local_308);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          bVar1 = false;
        }
      }
      std::
      _Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::~_Vector_base(&rawDescriptorSets.
                       super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                     );
      std::
      _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::~_Vector_base(&rawSetLayouts.
                       super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                     );
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_328);
      std::
      _Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ::~_Vector_base(&descriptorSetLayoutBindings.
                       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     );
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_388);
      value_00 = value_00 + VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
      if (!bVar1) goto LAB_004b308f;
    }
    lVar6 = local_428 + 1;
  }
  if (local_444 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,"Not validated",(allocator<char> *)&descriptorPoolCreateInfo);
    tcu::TestStatus::pass(local_440,(string *)local_308);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,"Pass",(allocator<char> *)&descriptorPoolCreateInfo);
    tcu::TestStatus::pass(local_440,(string *)local_308);
  }
  std::__cxx11::string::~string((string *)local_308);
LAB_004b308f:
  lVar6 = 0xf8;
  do {
    std::__cxx11::string::~string((string *)((long)&local_148[0]._M_current + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x20);
  return local_440;
}

Assistant:

tcu::TestStatus outOfPoolMemoryTest (Context& context)
{
	const DeviceInterface&	vkd							= context.getDeviceInterface();
	const VkDevice			device						= context.getDevice();
	const bool				expectOutOfPoolMemoryError	= de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1");
	deUint32				numErrorsReturned			= 0;

	const struct FailureCase
	{
		deUint32	poolDescriptorCount;		//!< total number of descriptors (of a given type) in the descriptor pool
		deUint32	poolMaxSets;				//!< max number of descriptor sets that can be allocated from the pool
		deUint32	bindingCount;				//!< number of bindings per descriptor set layout
		deUint32	bindingDescriptorCount;		//!< number of descriptors in a binding (array size) (in all bindings)
		deUint32	descriptorSetCount;			//!< number of descriptor sets to allocate
		string		description;				//!< the log message for this failure condition
	} failureCases[] =
	{
		//	pool			pool		binding		binding		alloc set
		//	descr. count	max sets	count		array size	count
		{	4u,				2u,			1u,			1u,			3u,		"Out of descriptor sets",											},
		{	3u,				4u,			1u,			1u,			4u,		"Out of descriptors (due to the number of sets)",					},
		{	2u,				1u,			3u,			1u,			1u,		"Out of descriptors (due to the number of bindings)",				},
		{	3u,				2u,			1u,			2u,			2u,		"Out of descriptors (due to descriptor array size)",				},
		{	5u,				1u,			2u,			3u,			1u,		"Out of descriptors (due to descriptor array size in all bindings)",},
	};

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
		<< tcu::TestLog::EndMessage;

	for (deUint32 failureCaseNdx = 0u; failureCaseNdx < DE_LENGTH_OF_ARRAY(failureCases); ++failureCaseNdx)
	{
		const FailureCase& params = failureCases[failureCaseNdx];
		context.getTestContext().getLog() << tcu::TestLog::Message << "Checking: " << params.description << tcu::TestLog::EndMessage;

		for (VkDescriptorType	descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
								descriptorType < VK_DESCRIPTOR_TYPE_LAST;
								descriptorType = static_cast<VkDescriptorType>(descriptorType + 1))
		{
			context.getTestContext().getLog() << tcu::TestLog::Message << "- " << getDescriptorTypeName(descriptorType) << tcu::TestLog::EndMessage;

			const VkDescriptorPoolSize					descriptorPoolSize =
			{
				descriptorType,												// type
				params.poolDescriptorCount,									// descriptorCount
			};

			const VkDescriptorPoolCreateInfo			descriptorPoolCreateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,				// VkStructureType                sType;
				DE_NULL,													// const void*                    pNext;
				(VkDescriptorPoolCreateFlags)0,								// VkDescriptorPoolCreateFlags    flags;
				params.poolMaxSets,											// uint32_t                       maxSets;
				1u,															// uint32_t                       poolSizeCount;
				&descriptorPoolSize,										// const VkDescriptorPoolSize*    pPoolSizes;
			};

			const Unique<VkDescriptorPool>				descriptorPool(createDescriptorPool(vkd, device, &descriptorPoolCreateInfo));

			const VkDescriptorSetLayoutBinding			descriptorSetLayoutBinding =
			{
				0u,															// uint32_t              binding;
				descriptorType,												// VkDescriptorType      descriptorType;
				params.bindingDescriptorCount,								// uint32_t              descriptorCount;
				VK_SHADER_STAGE_ALL,										// VkShaderStageFlags    stageFlags;
				DE_NULL,													// const VkSampler*      pImmutableSamplers;
			};

			const vector<VkDescriptorSetLayoutBinding>	descriptorSetLayoutBindings (params.bindingCount, descriptorSetLayoutBinding);
			const VkDescriptorSetLayoutCreateInfo		descriptorSetLayoutInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,		// VkStructureType                        sType;
				DE_NULL,													// const void*                            pNext;
				(VkDescriptorSetLayoutCreateFlags)0,						// VkDescriptorSetLayoutCreateFlags       flags;
				static_cast<deUint32>(descriptorSetLayoutBindings.size()),	// uint32_t                               bindingCount;
				&descriptorSetLayoutBindings[0],							// const VkDescriptorSetLayoutBinding*    pBindings;
			};

			const Unique<VkDescriptorSetLayout>			descriptorSetLayout	(createDescriptorSetLayout(vkd, device, &descriptorSetLayoutInfo));
			const vector<VkDescriptorSetLayout>			rawSetLayouts		(params.descriptorSetCount, *descriptorSetLayout);
			vector<VkDescriptorSet>						rawDescriptorSets	(params.descriptorSetCount, DE_NULL);

			const VkDescriptorSetAllocateInfo			descriptorSetAllocateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,				// VkStructureType                 sType;
				DE_NULL,													// const void*                     pNext;
				*descriptorPool,											// VkDescriptorPool                descriptorPool;
				static_cast<deUint32>(rawSetLayouts.size()),				// uint32_t                        descriptorSetCount;
				&rawSetLayouts[0],											// const VkDescriptorSetLayout*    pSetLayouts;
			};

			const VkResult result = vkd.allocateDescriptorSets(device, &descriptorSetAllocateInfo, &rawDescriptorSets[0]);

			if (result != VK_SUCCESS)
			{
				++numErrorsReturned;

				if (expectOutOfPoolMemoryError && result != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)
					return tcu::TestStatus::fail("Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got " + string(getResultName(result)) + " instead");
			}
			else
				context.getTestContext().getLog() << tcu::TestLog::Message << "  Allocation was successful anyway" << tcu::TestLog::EndMessage;
		}
	}

	if (numErrorsReturned == 0u)
		return tcu::TestStatus::pass("Not validated");
	else
		return tcu::TestStatus::pass("Pass");
}